

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlElementContentPtr xmlParseElementMixedContentDecl(xmlParserCtxtPtr ctxt,int inputchk)

{
  xmlElementContentPtr pxVar1;
  xmlElementContentPtr pxVar2;
  bool bVar3;
  xmlChar *local_40;
  xmlChar *elem;
  xmlElementContentPtr n;
  xmlElementContentPtr cur;
  xmlElementContentPtr ret;
  int inputchk_local;
  xmlParserCtxtPtr ctxt_local;
  
  cur = (xmlElementContentPtr)0x0;
  local_40 = (xmlChar *)0x0;
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if (((((*ctxt->input->cur == '#') && (ctxt->input->cur[1] == 'P')) && (ctxt->input->cur[2] == 'C')
       ) && ((ctxt->input->cur[3] == 'D' && (ctxt->input->cur[4] == 'A')))) &&
     ((ctxt->input->cur[5] == 'T' && (ctxt->input->cur[6] == 'A')))) {
    ctxt->input->cur = ctxt->input->cur + 7;
    ctxt->input->col = ctxt->input->col + 7;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    xmlSkipBlankChars(ctxt);
    if (((ctxt->progressive == 0) && (500 < (long)ctxt->input->cur - (long)ctxt->input->base)) &&
       ((long)ctxt->input->end - (long)ctxt->input->cur < 500)) {
      xmlSHRINK(ctxt);
    }
    if (*ctxt->input->cur == ')') {
      if (ctxt->input->id != inputchk) {
        xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                       "Element content declaration doesn\'t start and stop in the same entity\n");
      }
      xmlNextChar(ctxt);
      ctxt_local = (xmlParserCtxtPtr)
                   xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_PCDATA);
      if (ctxt_local == (xmlParserCtxtPtr)0x0) {
        ctxt_local = (xmlParserCtxtPtr)0x0;
      }
      else if (*ctxt->input->cur == '*') {
        *(xmlElementContentOccur *)((long)&ctxt_local->sax + 4) = XML_ELEMENT_CONTENT_MULT;
        xmlNextChar(ctxt);
      }
    }
    else if (((*ctxt->input->cur == '(') || (n = cur, *ctxt->input->cur == '|')) &&
            (n = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_PCDATA),
            cur = n, n == (xmlElementContentPtr)0x0)) {
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      while( true ) {
        bVar3 = false;
        if (*ctxt->input->cur == '|') {
          bVar3 = ctxt->instate != XML_PARSER_EOF;
        }
        if (!bVar3) {
          if ((*ctxt->input->cur != ')') || (ctxt->input->cur[1] != '*')) {
            xmlFreeDocElementContent(ctxt->myDoc,cur);
            xmlFatalErr(ctxt,XML_ERR_MIXED_NOT_STARTED,(char *)0x0);
            return (xmlElementContentPtr)0x0;
          }
          if (local_40 != (xmlChar *)0x0) {
            pxVar2 = xmlNewDocElementContent(ctxt->myDoc,local_40,XML_ELEMENT_CONTENT_ELEMENT);
            n->c2 = pxVar2;
            if (n->c2 != (_xmlElementContent *)0x0) {
              n->c2->parent = n;
            }
          }
          if (cur != (xmlElementContentPtr)0x0) {
            cur->ocur = XML_ELEMENT_CONTENT_MULT;
          }
          if (ctxt->input->id != inputchk) {
            xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                           "Element content declaration doesn\'t start and stop in the same entity\n"
                          );
          }
          ctxt->input->cur = ctxt->input->cur + 2;
          ctxt->input->col = ctxt->input->col + 2;
          if (*ctxt->input->cur == '\0') {
            xmlParserInputGrow(ctxt->input,0xfa);
          }
          goto LAB_00179cf2;
        }
        xmlNextChar(ctxt);
        if (local_40 == (xmlChar *)0x0) {
          cur = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_OR);
          if (cur == (xmlElementContentPtr)0x0) {
            xmlFreeDocElementContent(ctxt->myDoc,n);
            return (xmlElementContentPtr)0x0;
          }
          cur->c1 = n;
          pxVar2 = cur;
          if (n != (xmlElementContentPtr)0x0) {
            n->parent = cur;
          }
        }
        else {
          pxVar2 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_OR);
          if (pxVar2 == (xmlElementContentPtr)0x0) {
            xmlFreeDocElementContent(ctxt->myDoc,cur);
            return (xmlElementContentPtr)0x0;
          }
          pxVar1 = xmlNewDocElementContent(ctxt->myDoc,local_40,XML_ELEMENT_CONTENT_ELEMENT);
          pxVar2->c1 = pxVar1;
          if (pxVar2->c1 != (_xmlElementContent *)0x0) {
            pxVar2->c1->parent = pxVar2;
          }
          n->c2 = pxVar2;
          if (pxVar2 != (xmlElementContentPtr)0x0) {
            pxVar2->parent = n;
          }
        }
        n = pxVar2;
        xmlSkipBlankChars(ctxt);
        local_40 = xmlParseName(ctxt);
        if (local_40 == (xmlChar *)0x0) break;
        xmlSkipBlankChars(ctxt);
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
      }
      xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"xmlParseElementMixedContentDecl : Name expected\n")
      ;
      xmlFreeDocElementContent(ctxt->myDoc,cur);
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_PCDATA_REQUIRED,(char *)0x0);
LAB_00179cf2:
    ctxt_local = (xmlParserCtxtPtr)cur;
  }
  return (xmlElementContentPtr)ctxt_local;
}

Assistant:

xmlElementContentPtr
xmlParseElementMixedContentDecl(xmlParserCtxtPtr ctxt, int inputchk) {
    xmlElementContentPtr ret = NULL, cur = NULL, n;
    const xmlChar *elem = NULL;

    GROW;
    if (CMP7(CUR_PTR, '#', 'P', 'C', 'D', 'A', 'T', 'A')) {
	SKIP(7);
	SKIP_BLANKS;
	SHRINK;
	if (RAW == ')') {
	    if (ctxt->input->id != inputchk) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Element content declaration doesn't start and"
                               " stop in the same entity\n");
	    }
	    NEXT;
	    ret = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_PCDATA);
	    if (ret == NULL)
	        return(NULL);
	    if (RAW == '*') {
		ret->ocur = XML_ELEMENT_CONTENT_MULT;
		NEXT;
	    }
	    return(ret);
	}
	if ((RAW == '(') || (RAW == '|')) {
	    ret = cur = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_PCDATA);
	    if (ret == NULL) return(NULL);
	}
	while ((RAW == '|') && (ctxt->instate != XML_PARSER_EOF)) {
	    NEXT;
	    if (elem == NULL) {
	        ret = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_OR);
		if (ret == NULL) {
		    xmlFreeDocElementContent(ctxt->myDoc, cur);
                    return(NULL);
                }
		ret->c1 = cur;
		if (cur != NULL)
		    cur->parent = ret;
		cur = ret;
	    } else {
	        n = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_OR);
		if (n == NULL) {
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
                    return(NULL);
                }
		n->c1 = xmlNewDocElementContent(ctxt->myDoc, elem, XML_ELEMENT_CONTENT_ELEMENT);
		if (n->c1 != NULL)
		    n->c1->parent = n;
	        cur->c2 = n;
		if (n != NULL)
		    n->parent = cur;
		cur = n;
	    }
	    SKIP_BLANKS;
	    elem = xmlParseName(ctxt);
	    if (elem == NULL) {
		xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			"xmlParseElementMixedContentDecl : Name expected\n");
		xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    SKIP_BLANKS;
	    GROW;
	}
	if ((RAW == ')') && (NXT(1) == '*')) {
	    if (elem != NULL) {
		cur->c2 = xmlNewDocElementContent(ctxt->myDoc, elem,
		                               XML_ELEMENT_CONTENT_ELEMENT);
		if (cur->c2 != NULL)
		    cur->c2->parent = cur;
            }
            if (ret != NULL)
                ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    if (ctxt->input->id != inputchk) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Element content declaration doesn't start and"
                               " stop in the same entity\n");
	    }
	    SKIP(2);
	} else {
	    xmlFreeDocElementContent(ctxt->myDoc, ret);
	    xmlFatalErr(ctxt, XML_ERR_MIXED_NOT_STARTED, NULL);
	    return(NULL);
	}

    } else {
	xmlFatalErr(ctxt, XML_ERR_PCDATA_REQUIRED, NULL);
    }
    return(ret);
}